

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O1

void sort_handlers(deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks)

{
  _Elt_pointer ppVVar1;
  _Elt_pointer ppVVar2;
  _Elt_pointer ppVVar3;
  _Elt_pointer ppVVar4;
  _Map_pointer pppVVar5;
  _Elt_pointer ppVVar6;
  _Elt_pointer ppVVar7;
  _Map_pointer pppVVar8;
  long lVar9;
  ulong uVar10;
  _Deque_iterator<ValueCallback_*,_ValueCallback_*&,_ValueCallback_**> local_b0;
  _Deque_iterator<ValueCallback_*,_ValueCallback_*&,_ValueCallback_**> local_90;
  _Deque_iterator<ValueCallback_*,_ValueCallback_*&,_ValueCallback_**> local_70;
  _Deque_iterator<ValueCallback_*,_ValueCallback_*&,_ValueCallback_**> local_50;
  
  ppVVar1 = (callbacks->super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>).
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVVar2 = (callbacks->super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>).
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar1 != ppVVar2) {
    ppVVar3 = (callbacks->super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>).
              _M_impl.super__Deque_impl_data._M_start._M_first;
    ppVVar4 = (callbacks->super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>).
              _M_impl.super__Deque_impl_data._M_start._M_last;
    pppVVar5 = (callbacks->super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>).
               _M_impl.super__Deque_impl_data._M_start._M_node;
    ppVVar6 = (callbacks->super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVVar7 = (callbacks->super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_last;
    pppVVar8 = (callbacks->super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_node;
    uVar10 = ((long)ppVVar4 - (long)ppVVar1 >> 3) + ((long)ppVVar2 - (long)ppVVar6 >> 3) +
             ((((ulong)((long)pppVVar8 - (long)pppVVar5) >> 3) - 1) +
             (ulong)(pppVVar8 == (_Map_pointer)0x0)) * 0x40;
    lVar9 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    local_70._M_cur = ppVVar2;
    local_70._M_first = ppVVar6;
    local_70._M_last = ppVVar7;
    local_70._M_node = pppVVar8;
    local_50._M_cur = ppVVar1;
    local_50._M_first = ppVVar3;
    local_50._M_last = ppVVar4;
    local_50._M_node = pppVVar5;
    std::
    __introsort_loop<std::_Deque_iterator<ValueCallback*,ValueCallback*&,ValueCallback**>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(ValueCallback_const*,ValueCallback_const*)>>
              (&local_50,&local_70,(ulong)(((uint)lVar9 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_ValueCallback_*,_const_ValueCallback_*)>)0x10bddb);
    local_b0._M_cur = ppVVar2;
    local_b0._M_first = ppVVar6;
    local_b0._M_last = ppVVar7;
    local_b0._M_node = pppVVar8;
    local_90._M_cur = ppVVar1;
    local_90._M_first = ppVVar3;
    local_90._M_last = ppVVar4;
    local_90._M_node = pppVVar5;
    std::
    __final_insertion_sort<std::_Deque_iterator<ValueCallback*,ValueCallback*&,ValueCallback**>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(ValueCallback_const*,ValueCallback_const*)>>
              (&local_90,&local_b0,
               (_Iter_comp_iter<bool_(*)(const_ValueCallback_*,_const_ValueCallback_*)>)0x10bddb);
  }
  return;
}

Assistant:

SNMP_ERROR_STATUS Counter32Callback::setTypeWithValue(BER_CONTAINER* rawValue){
    ASSERT_CALLBACK_SETTABLE();
    ASSERT_VALID_SETTABLE_VALUE(this->value);

    Counter32* val = static_cast<Counter32*>(rawValue);
    *this->value = val->_value;
    return NO_ERROR;
}